

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_props.cpp
# Opt level: O3

void __thiscall Prog::run(Prog *this)

{
  bool bVar1;
  
  Dialog::prepare(&this->d);
  while( true ) {
    bVar1 = Dialog::is_quit_requested(&this->d);
    if (bVar1) break;
    bVar1 = Dialog::is_draw_requested(&this->d);
    if (bVar1) {
      update_properties(this);
      al_map_rgb(0x80,0x80,0x80);
      al_clear_to_color();
      Dialog::draw(&this->d);
      al_flip_display();
    }
    Dialog::run_step(&this->d,true);
  }
  return;
}

Assistant:

void Prog::run()
{
   d.prepare();

   while (!d.is_quit_requested()) {
      if (d.is_draw_requested()) {
         update_properties();
         al_clear_to_color(al_map_rgb(128, 128, 128));
         d.draw();
         al_flip_display();
      }

      d.run_step(true);
   }
}